

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

void suboption(Curl_easy *data)

{
  uchar uVar1;
  connectdata *pcVar2;
  TELNET *pTVar3;
  curl_slist *pcVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  ssize_t sVar8;
  uint *puVar9;
  curl_slist **ppcVar10;
  uchar *puVar11;
  size_t length;
  undefined8 uStackY_870;
  char *pcVar12;
  uchar temp [2048];
  
  pcVar2 = data->conn;
  pTVar3 = (data->req).p.telnet;
  printsub(data,0x3c,pTVar3->subbuffer,(size_t)(pTVar3->subend + (2 - (long)pTVar3->subpointer)));
  puVar11 = pTVar3->subpointer;
  pTVar3->subpointer = puVar11 + 1;
  uVar1 = *puVar11;
  if (uVar1 == '\'') {
    curl_msnprintf((char *)temp,0x800,"%c%c%c%c",0xff,0xfa,0x27,0);
    ppcVar10 = &pTVar3->telnet_vars;
    length = 4;
    while( true ) {
      pcVar4 = *ppcVar10;
      puVar11 = temp + length;
      if (pcVar4 == (curl_slist *)0x0) break;
      pcVar12 = pcVar4->data;
      sVar6 = strlen(pcVar12);
      if (sVar6 + length + 1 < 0x7fa) {
        pcVar7 = strchr(pcVar12,0x2c);
        if (pcVar7 == (char *)0x0) {
          iVar5 = curl_msnprintf((char *)puVar11,0x800 - length,"%c%s",0,pcVar12);
        }
        else {
          iVar5 = curl_msnprintf((char *)puVar11,0x800 - length,"%c%.*s%c%s",0,
                                 (ulong)(uint)((int)pcVar7 - (int)pcVar12),pcVar12,1,pcVar7 + 1);
        }
        length = length + (long)iVar5;
      }
      ppcVar10 = &pcVar4->next;
    }
    curl_msnprintf((char *)puVar11,0x800 - length,"%c%c",0xff,0xf0);
    sVar6 = length + 2;
    iVar5 = pcVar2->sock[0];
  }
  else {
    if (uVar1 == '#') {
      pcVar12 = pTVar3->subopt_xdisploc;
      sVar6 = strlen(pcVar12);
      uStackY_870 = 0x23;
    }
    else {
      if (uVar1 != '\x18') {
        return;
      }
      pcVar12 = pTVar3->subopt_ttype;
      sVar6 = strlen(pcVar12);
      uStackY_870 = 0x18;
    }
    length = sVar6 + 4;
    sVar6 = sVar6 + 6;
    curl_msnprintf((char *)temp,0x800,"%c%c%c%c%s%c%c",0xff,0xfa,uStackY_870,0,pcVar12,0xff,0xf0);
    iVar5 = pcVar2->sock[0];
  }
  sVar8 = send(iVar5,temp,sVar6,0x4000);
  if (sVar8 < 0) {
    puVar9 = (uint *)__errno_location();
    Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar9);
  }
  printsub(data,0x3e,temp + 2,length);
  return;
}

Assistant:

static void suboption(struct Curl_easy *data)
{
  struct curl_slist *v;
  unsigned char temp[2048];
  ssize_t bytes_written;
  size_t len;
  int err;
  struct TELNET *tn = data->req.p.telnet;
  struct connectdata *conn = data->conn;

  printsub(data, '<', (unsigned char *)tn->subbuffer, CURL_SB_LEN(tn) + 2);
  switch(CURL_SB_GET(tn)) {
    case CURL_TELOPT_TTYPE:
      len = strlen(tn->subopt_ttype) + 4 + 2;
      msnprintf((char *)temp, sizeof(temp),
                "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_TTYPE,
                CURL_TELQUAL_IS, tn->subopt_ttype, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_XDISPLOC:
      len = strlen(tn->subopt_xdisploc) + 4 + 2;
      msnprintf((char *)temp, sizeof(temp),
                "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_XDISPLOC,
                CURL_TELQUAL_IS, tn->subopt_xdisploc, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_NEW_ENVIRON:
      msnprintf((char *)temp, sizeof(temp),
                "%c%c%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_NEW_ENVIRON,
                CURL_TELQUAL_IS);
      len = 4;

      for(v = tn->telnet_vars; v; v = v->next) {
        size_t tmplen = (strlen(v->data) + 1);
        /* Add the variable if it fits */
        if(len + tmplen < (int)sizeof(temp)-6) {
          char *s = strchr(v->data, ',');
          if(!s)
            len += msnprintf((char *)&temp[len], sizeof(temp) - len,
                             "%c%s", CURL_NEW_ENV_VAR, v->data);
          else {
            size_t vlen = s - v->data;
            len += msnprintf((char *)&temp[len], sizeof(temp) - len,
                             "%c%.*s%c%s", CURL_NEW_ENV_VAR,
                             (int)vlen, v->data, CURL_NEW_ENV_VALUE, ++s);
          }
        }
      }
      msnprintf((char *)&temp[len], sizeof(temp) - len,
                "%c%c", CURL_IAC, CURL_SE);
      len += 2;
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
  }
  return;
}